

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

size_t __thiscall
MemoryLeakDetectorList::getTotalLeaks(MemoryLeakDetectorList *this,MemLeakPeriod period)

{
  bool bVar1;
  MemLeakPeriod in_ESI;
  MemoryLeakDetectorList *in_RDI;
  MemoryLeakDetectorNode *node;
  size_t total_leaks;
  MemoryLeakDetectorNode *local_20;
  size_t local_18;
  
  local_18 = 0;
  for (local_20 = in_RDI->head_; local_20 != (MemoryLeakDetectorNode *)0x0;
      local_20 = *(MemoryLeakDetectorNode **)(local_20 + 0x38)) {
    bVar1 = isInPeriod(in_RDI,local_20,in_ESI);
    if (bVar1) {
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

size_t MemoryLeakDetectorList::getTotalLeaks(MemLeakPeriod period)
{
    size_t total_leaks = 0;
    for (MemoryLeakDetectorNode* node = head_; node; node = node->next_) {
        if (isInPeriod(node, period)) total_leaks++;
    }
    return total_leaks;
}